

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4.h
# Opt level: O0

void __thiscall irr::core::CMatrix4<float>::getTransposed(CMatrix4<float> *this,CMatrix4<float> *o)

{
  float fVar1;
  float *pfVar2;
  CMatrix4<float> *in_RSI;
  float *in_RDI;
  
  fVar1 = *in_RDI;
  pfVar2 = operator[](in_RSI,0);
  *pfVar2 = fVar1;
  fVar1 = in_RDI[4];
  pfVar2 = operator[](in_RSI,1);
  *pfVar2 = fVar1;
  fVar1 = in_RDI[8];
  pfVar2 = operator[](in_RSI,2);
  *pfVar2 = fVar1;
  fVar1 = in_RDI[0xc];
  pfVar2 = operator[](in_RSI,3);
  *pfVar2 = fVar1;
  fVar1 = in_RDI[1];
  pfVar2 = operator[](in_RSI,4);
  *pfVar2 = fVar1;
  fVar1 = in_RDI[5];
  pfVar2 = operator[](in_RSI,5);
  *pfVar2 = fVar1;
  fVar1 = in_RDI[9];
  pfVar2 = operator[](in_RSI,6);
  *pfVar2 = fVar1;
  fVar1 = in_RDI[0xd];
  pfVar2 = operator[](in_RSI,7);
  *pfVar2 = fVar1;
  fVar1 = in_RDI[2];
  pfVar2 = operator[](in_RSI,8);
  *pfVar2 = fVar1;
  fVar1 = in_RDI[6];
  pfVar2 = operator[](in_RSI,9);
  *pfVar2 = fVar1;
  fVar1 = in_RDI[10];
  pfVar2 = operator[](in_RSI,10);
  *pfVar2 = fVar1;
  fVar1 = in_RDI[0xe];
  pfVar2 = operator[](in_RSI,0xb);
  *pfVar2 = fVar1;
  fVar1 = in_RDI[3];
  pfVar2 = operator[](in_RSI,0xc);
  *pfVar2 = fVar1;
  fVar1 = in_RDI[7];
  pfVar2 = operator[](in_RSI,0xd);
  *pfVar2 = fVar1;
  fVar1 = in_RDI[0xb];
  pfVar2 = operator[](in_RSI,0xe);
  *pfVar2 = fVar1;
  fVar1 = in_RDI[0xf];
  pfVar2 = operator[](in_RSI,0xf);
  *pfVar2 = fVar1;
  return;
}

Assistant:

inline void CMatrix4<T>::getTransposed(CMatrix4<T> &o) const
{
	o[0] = M[0];
	o[1] = M[4];
	o[2] = M[8];
	o[3] = M[12];

	o[4] = M[1];
	o[5] = M[5];
	o[6] = M[9];
	o[7] = M[13];

	o[8] = M[2];
	o[9] = M[6];
	o[10] = M[10];
	o[11] = M[14];

	o[12] = M[3];
	o[13] = M[7];
	o[14] = M[11];
	o[15] = M[15];
#if defined(USE_MATRIX_TEST)
	o.definitelyIdentityMatrix = definitelyIdentityMatrix;
#endif
}